

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall CLI::App::get_option(App *this,string *option_name)

{
  pointer pcVar1;
  pointer puVar2;
  pointer psVar3;
  App *this_00;
  bool bVar4;
  Option *pOVar5;
  OptionNotFound *this_01;
  pointer puVar6;
  shared_ptr<CLI::App> *subc;
  pointer psVar7;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar1 = (option_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + option_name->_M_string_length);
  puVar6 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar2) {
    do {
      bVar4 = Option::check_name((puVar6->_M_t).
                                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                                 .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_90
                                );
      if (bVar4) {
        pOVar5 = (puVar6->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        goto LAB_0012659d;
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  psVar7 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar3) {
    do {
      this_00 = (psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((this_00->name_)._M_string_length == 0) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_90._M_dataplus._M_p,
                   local_90._M_dataplus._M_p + local_90._M_string_length);
        pOVar5 = get_option_no_throw(this_00,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (pOVar5 != (Option *)0x0) goto LAB_0012659d;
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar3);
  }
  pOVar5 = (Option *)0x0;
LAB_0012659d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (pOVar5 == (Option *)0x0) {
    this_01 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar1 = (option_name->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + option_name->_M_string_length);
    OptionNotFound::OptionNotFound(this_01,&local_70);
    __cxa_throw(this_01,&OptionNotFound::typeinfo,Error::~Error);
  }
  return pOVar5;
}

Assistant:

CLI11_NODISCARD const Option *get_option(std::string option_name) const {
        const auto *opt = get_option_no_throw(option_name);
        if(opt == nullptr) {
            throw OptionNotFound(option_name);
        }
        return opt;
    }